

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

void __thiscall SourceDependChildren::addChild(SourceDependChildren *this,SourceFile *s)

{
  int iVar1;
  SourceFile **ppSVar2;
  
  iVar1 = this->num_nodes;
  if (iVar1 <= this->used_nodes) {
    this->num_nodes = iVar1 + 200;
    ppSVar2 = (SourceFile **)realloc(this->children,(long)iVar1 * 8 + 0x640);
    this->children = ppSVar2;
  }
  iVar1 = this->used_nodes;
  this->used_nodes = iVar1 + 1;
  this->children[iVar1] = s;
  return;
}

Assistant:

void addChild(SourceFile *s) {
        if(num_nodes <= used_nodes) {
            num_nodes += 200;
            children = (SourceFile**)realloc(children, sizeof(SourceFile*)*(num_nodes));
        }
        children[used_nodes++] = s;
    }